

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O1

void If_CutRotatePins(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Mem_t *pVVar4;
  word *pTruth;
  word *pwVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  void *in_RDX;
  uint uVar9;
  float PinDelays [32];
  float local_98 [34];
  
  if (p->pPars->fUseTtPerm != 0) {
    __assert_fail("!p->pPars->fUseTtPerm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                  ,0x48,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
  }
  uVar9 = *(uint *)&pCut->field_0x1c >> 0x18;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    pVVar3 = p->vObjs;
    uVar7 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar7];
      if (((long)(int)fVar1 < 0) || (pVVar3->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      in_RDX = pVVar3->pArray[(int)fVar1];
      if (in_RDX == (void *)0x0) break;
      local_98[uVar7] = *(float *)((long)in_RDX + 0x5c);
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  pVVar4 = p->vTtMem[uVar9];
  if (pVVar4 == (Vec_Mem_t *)0x0) {
    If_CutTruthPermute((word *)0x0,uVar9,(int)in_RDX,p->nTruth6Words[uVar9],local_98,
                       (int *)(pCut + 1));
  }
  else {
    if (pCut->iCutFunc < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar8 = (uint)pCut->iCutFunc >> 1;
    uVar7 = (ulong)uVar8;
    if (pVVar4->nEntries <= (int)uVar8) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pTruth = p->puTempW;
    iVar6 = p->nTruth6Words[uVar9];
    if (0 < (long)iVar6) {
      uVar9 = pVVar4->PageMask;
      iVar2 = pVVar4->nEntrySize;
      pwVar5 = pVVar4->ppPages[uVar8 >> ((byte)pVVar4->LogPageSze & 0x1f)];
      uVar7 = 0;
      do {
        pTruth[uVar7] = pwVar5[(long)(int)((uVar8 & uVar9) * iVar2) + uVar7];
        uVar7 = uVar7 + 1;
      } while ((long)iVar6 != uVar7);
    }
    If_CutTruthPermute(pTruth,(uint)(byte)pCut->field_0x1f,(int)uVar7,
                       p->nTruth6Words[(byte)pCut->field_0x1f],local_98,(int *)(pCut + 1));
    iVar6 = Vec_MemHashInsert(p->vTtMem[(byte)pCut->field_0x1f],p->puTempW);
    if (pCut->iCutFunc < 0) {
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/if.h"
                    ,0x1b5,"int If_CutTruthIsCompl(If_Cut_t *)");
    }
    if (iVar6 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    pCut->iCutFunc = (pCut->iCutFunc & 1U) + iVar6 * 2;
    if ((*p->puTempW & 1) != 0) {
      __assert_fail("(p->puTempW[0] & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                    ,0x54,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
    }
  }
  return;
}

Assistant:

void If_CutRotatePins( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float PinDelays[IF_MAX_LUTSIZE];
    int i, truthId;
    assert( !p->pPars->fUseTtPerm );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        PinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    if ( p->vTtMem[pCut->nLeaves] == NULL )
    {
        If_CutTruthPermute( NULL, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
        return;
    }
    Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], 0 );
    If_CutTruthPermute( p->puTempW, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], p->puTempW );
    pCut->iCutFunc = Abc_Var2Lit( truthId, If_CutTruthIsCompl(pCut) );
    assert( (p->puTempW[0] & 1) == 0 );
}